

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MedianFilterCV_8U.cpp
# Opt level: O0

void __thiscall MedianFilterCV_8U::filter(MedianFilterCV_8U *this)

{
  uchar uVar1;
  int y_00;
  Mat *this_00;
  uchar *puVar2;
  pair<unsigned_char,_unsigned_char> local_36;
  int y_2;
  int local_30;
  int y_1;
  int x_1;
  int local_24;
  int x;
  int y;
  pair<unsigned_char,_unsigned_char> pairOfMedians;
  MedianFilterCV_8U *this_local;
  
  this_00 = (Mat *)operator_new(0x60);
  cv::Mat::Mat(this_00,*(int *)(this->sourceImage + 8),*(int *)(this->sourceImage + 0xc),0);
  this->resultImage = this_00;
  std::pair<unsigned_char,_unsigned_char>::pair<unsigned_char,_unsigned_char,_true>
            ((pair<unsigned_char,_unsigned_char> *)((long)&x + 2));
  for (local_24 = 1; local_24 < *(int *)(this->sourceImage + 8) + -1; local_24 = local_24 + 1) {
    for (x_1 = 1; x_1 < *(int *)(this->sourceImage + 0xc) + -2; x_1 = x_1 + 2) {
      y_1._2_2_ = getPairMedian(this,this->sourceImage,local_24,x_1,false);
      std::pair<unsigned_char,_unsigned_char>::operator=
                ((pair<unsigned_char,_unsigned_char> *)((long)&x + 2),(type)((long)&y_1 + 2));
      uVar1 = getActualPixel(this,x._2_1_,local_24,x_1);
      puVar2 = cv::Mat::at<unsigned_char>(this->resultImage,local_24,x_1);
      *puVar2 = uVar1;
      uVar1 = getActualPixel(this,x._3_1_,local_24,x_1 + 1);
      puVar2 = cv::Mat::at<unsigned_char>(this->resultImage,local_24,x_1 + 1);
      *puVar2 = uVar1;
    }
  }
  if (*(int *)(this->sourceImage + 0xc) % 2 == 1) {
    local_30 = *(int *)(this->sourceImage + 0xc) + -2;
    for (y_2 = 1; y_2 < *(int *)(this->sourceImage + 8) + -2; y_2 = y_2 + 2) {
      local_36 = getPairMedian(this,this->sourceImage,y_2,local_30,true);
      std::pair<unsigned_char,_unsigned_char>::operator=
                ((pair<unsigned_char,_unsigned_char> *)((long)&x + 2),&local_36);
      uVar1 = getActualPixel(this,x._2_1_,y_2,local_30);
      puVar2 = cv::Mat::at<unsigned_char>(this->resultImage,y_2,local_30);
      *puVar2 = uVar1;
      uVar1 = getActualPixel(this,x._3_1_,y_2 + 1,local_30);
      puVar2 = cv::Mat::at<unsigned_char>(this->resultImage,y_2 + 1,local_30);
      *puVar2 = uVar1;
    }
    if (*(int *)(this->sourceImage + 8) % 2 == 1) {
      y_00 = *(int *)(this->sourceImage + 8) + -2;
      uVar1 = getMedian(this,this->sourceImage,y_00,local_30);
      uVar1 = getActualPixel(this,uVar1,y_00,local_30);
      puVar2 = cv::Mat::at<unsigned_char>
                         (this->resultImage,*(int *)(this->sourceImage + 8) + -2,
                          *(int *)(this->sourceImage + 0xc) + -2);
      *puVar2 = uVar1;
    }
  }
  filterImageEdges(this,this->sourceImage);
  return;
}

Assistant:

void MedianFilterCV_8U::filter() {
    resultImage = new cv::Mat(sourceImage->rows, sourceImage->cols, CV_8U);

    std::pair<uchar, uchar> pairOfMedians;                                // 1 operation
    for (int y = 1; y < sourceImage->rows - 1; ++y) {                     // 1 + 5 operations at every step (539 steps if rows=1080)
        for (int x = 1; x < sourceImage->cols - 2; x += 2) {              // 1 + 5 operations at every step (959 steps if cols=1920)
            pairOfMedians = getPairMedian(*sourceImage, y, x, false);     // 1 operation + operations of getPairMedian(420/567)

            resultImage->at<uchar>(y, x) = getActualPixel(pairOfMedians.first, y, x);          // 2 operations + operations of getActual(9)
            resultImage->at<uchar>(y, x + 1) = getActualPixel(pairOfMedians.second, y, x + 1); // 4 operations + operations of getActual(9)
        }
    }

    // if the last two columns are not processed
    if (sourceImage->cols % 2 == 1) {                                     // 3 operations
        int x = sourceImage->cols - 2;                                    // 3 operations

        for (int y = 1; y < sourceImage->rows - 2; y += 2) {              // 1 + 5 operations at every step
            pairOfMedians = getPairMedian(*sourceImage, y, x, true);      // 2 operations + operations of getPairMedian (420/567)
            resultImage->at<uchar>(y, x) = getActualPixel(pairOfMedians.first, y, x);          // 3 operations + operations of getActual(9)
            resultImage->at<uchar>(y + 1, x) = getActualPixel(pairOfMedians.second, y + 1, x); // 5 operations + operations of getActual(9)
        }

        if (sourceImage->rows % 2 == 1) {
            int y = sourceImage->rows - 2;                                // 3 operations
            resultImage->at<uchar>(sourceImage->rows - 2, sourceImage->cols - 2) =
                    getActualPixel(getMedian(*sourceImage, y, x), y, x);  // 6 operations + operations of getActaulPixel
                                                                          // and getMedian
        }
    }

    filterImageEdges(*sourceImage);                                       // 1 operations + operations of filterImageEdges
}